

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_iso9660.c
# Opt level: O0

int iso9660_free(archive_write *a)

{
  iso9660_conflict *iso9660_00;
  int iVar1;
  int local_1c;
  int ret;
  int i;
  iso9660_conflict *iso9660;
  archive_write *a_local;
  
  iso9660_00 = (iso9660_conflict *)a->format_data;
  if (-1 < iso9660_00->temp_fd) {
    close(iso9660_00->temp_fd);
  }
  iVar1 = zisofs_free(a);
  isoent_free_all((iso9660_00->primary).rootent);
  for (local_1c = 0; local_1c < (iso9660_00->primary).max_depth; local_1c = local_1c + 1) {
    free((iso9660_00->primary).pathtbl[local_1c].sorted);
  }
  free((iso9660_00->primary).pathtbl);
  if (((uint)iso9660_00->opt >> 0x11 & 3) != 0) {
    isoent_free_all((iso9660_00->joliet).rootent);
    for (local_1c = 0; local_1c < (iso9660_00->joliet).max_depth; local_1c = local_1c + 1) {
      free((iso9660_00->joliet).pathtbl[local_1c].sorted);
    }
    free((iso9660_00->joliet).pathtbl);
  }
  isofile_free_all_entries(iso9660_00);
  isofile_free_hardlinks(iso9660_00);
  archive_string_free(&iso9660_00->cur_dirstr);
  archive_string_free(&iso9660_00->volume_identifier);
  archive_string_free(&iso9660_00->publisher_identifier);
  archive_string_free(&iso9660_00->data_preparer_identifier);
  archive_string_free(&iso9660_00->application_identifier);
  archive_string_free(&iso9660_00->copyright_file_identifier);
  archive_string_free(&iso9660_00->abstract_file_identifier);
  archive_string_free(&iso9660_00->bibliographic_file_identifier);
  archive_string_free(&(iso9660_00->el_torito).catalog_filename);
  archive_string_free(&(iso9660_00->el_torito).boot_filename);
  archive_string_free(&(iso9660_00->el_torito).id);
  archive_string_free(&iso9660_00->utf16be);
  archive_string_free(&iso9660_00->mbs);
  free(iso9660_00);
  a->format_data = (void *)0x0;
  return iVar1;
}

Assistant:

static int
iso9660_free(struct archive_write *a)
{
	struct iso9660 *iso9660;
	int i, ret;

	iso9660 = a->format_data;

	/* Close the temporary file. */
	if (iso9660->temp_fd >= 0)
		close(iso9660->temp_fd);

	/* Free some stuff for zisofs operations. */
	ret = zisofs_free(a);

	/* Remove directory entries in tree which includes file entries. */
	isoent_free_all(iso9660->primary.rootent);
	for (i = 0; i < iso9660->primary.max_depth; i++)
		free(iso9660->primary.pathtbl[i].sorted);
	free(iso9660->primary.pathtbl);

	if (iso9660->opt.joliet) {
		isoent_free_all(iso9660->joliet.rootent);
		for (i = 0; i < iso9660->joliet.max_depth; i++)
			free(iso9660->joliet.pathtbl[i].sorted);
		free(iso9660->joliet.pathtbl);
	}

	/* Remove isofile entries. */
	isofile_free_all_entries(iso9660);
	isofile_free_hardlinks(iso9660);

	archive_string_free(&(iso9660->cur_dirstr));
	archive_string_free(&(iso9660->volume_identifier));
	archive_string_free(&(iso9660->publisher_identifier));
	archive_string_free(&(iso9660->data_preparer_identifier));
	archive_string_free(&(iso9660->application_identifier));
	archive_string_free(&(iso9660->copyright_file_identifier));
	archive_string_free(&(iso9660->abstract_file_identifier));
	archive_string_free(&(iso9660->bibliographic_file_identifier));
	archive_string_free(&(iso9660->el_torito.catalog_filename));
	archive_string_free(&(iso9660->el_torito.boot_filename));
	archive_string_free(&(iso9660->el_torito.id));
	archive_string_free(&(iso9660->utf16be));
	archive_string_free(&(iso9660->mbs));

	free(iso9660);
	a->format_data = NULL;

	return (ret);
}